

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Optional<Corrade::Containers::String> * Corrade::Utility::Path::temporaryDirectory(void)

{
  Optional<Corrade::Containers::String> *in_RDI;
  StringView view;
  String SStack_28;
  
  view._sizePlusFlags = 0xc000000000000004;
  view._data = "/tmp";
  Containers::String::String(&SStack_28,view);
  in_RDI->_set = true;
  Containers::String::String((String *)in_RDI,&SStack_28);
  Containers::String::~String(&SStack_28);
  return in_RDI;
}

Assistant:

Containers::Optional<Containers::String> temporaryDirectory() {
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    /* Sandboxed OSX, iOS */
    #ifdef CORRADE_TARGET_APPLE
    if(System::isSandboxed()) {
        /* Not delegating into homeDirectory() as the (admittedly rare) error
           message would have a confusing source */
        const char* const home = std::getenv("HOME");
        if(!home) {
            Error{} << "Utility::Path::temporaryDirectory(): $HOME not available";
            return {};
        }

        return join(home, "tmp"_s);
    }
    #endif

    /* Android, you had to be special, right? */
    #ifdef CORRADE_TARGET_ANDROID
    return Containers::String{"/data/local/tmp"_s};
    #endif

    /* Common Unix, Emscripten */
    return Containers::String{"/tmp"_s};

    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    /* Windows */

    /* Get path size. Includes a trailing slash and a zero terminator. */
    wchar_t c;
    const std::size_t size = GetTempPathW(1, &c);
    CORRADE_INTERNAL_ASSERT(size >= 2);

    /* Get the path, convert to forward slashes, strip the trailing slash and
       zero terminator */
    Containers::Array<wchar_t> path{NoInit, size};
    GetTempPathW(size, path);
    return fromNativeSeparators(Unicode::narrow(path.exceptSuffix(2)));
    #else
    Error{} << "Utility::Path::temporaryDirectory(): not implemented on this platform";
    return {};
    #endif
}